

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O0

void GccPlatformSpecificRunTestInASeperateProcess
               (UtestShell *shell,TestPlugin *plugin,TestResult *result)

{
  bool bVar1;
  size_t sVar2;
  TestResult *pTVar3;
  TestPlugin *pTVar4;
  size_t sVar5;
  int *piVar6;
  SimpleString local_1b8;
  TestFailure local_1a8;
  SimpleString local_140;
  TestFailure local_130;
  ulong local_c8;
  size_t amountOfRetries;
  size_t initialFailureCount;
  SimpleString local_a8;
  TestFailure local_98;
  uint local_30;
  int local_2c;
  int status;
  pid_t w;
  pid_t cpid;
  pid_t syscallError;
  TestResult *result_local;
  TestPlugin *plugin_local;
  UtestShell *shell_local;
  
  w = -1;
  local_30 = 0;
  _cpid = result;
  result_local = (TestResult *)plugin;
  plugin_local = (TestPlugin *)shell;
  status = (*PlatformSpecificFork)();
  pTVar4 = plugin_local;
  pTVar3 = _cpid;
  if (status == -1) {
    SimpleString::SimpleString(&local_a8,"Call to fork() failed");
    TestFailure::TestFailure(&local_98,(UtestShell *)pTVar4,&local_a8);
    (*pTVar3->_vptr_TestResult[0xd])(pTVar3,&local_98);
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_a8);
  }
  else {
    if (status == 0) {
      amountOfRetries = TestResult::getFailureCount(_cpid);
      (*plugin_local->_vptr_TestPlugin[0x25])(plugin_local,result_local,_cpid);
      sVar2 = amountOfRetries;
      sVar5 = TestResult::getFailureCount(_cpid);
      _exit((uint)(sVar2 < sVar5));
    }
    local_c8 = 0;
    do {
      local_2c = (*PlatformSpecificWaitPid)(status,(int *)&local_30,2);
      if (local_2c == -1) {
        piVar6 = __errno_location();
        pTVar4 = plugin_local;
        pTVar3 = _cpid;
        if (*piVar6 != 4) {
          SimpleString::SimpleString(&local_1b8,"Call to waitpid() failed");
          TestFailure::TestFailure(&local_1a8,(UtestShell *)pTVar4,&local_1b8);
          (*pTVar3->_vptr_TestResult[0xd])(pTVar3,&local_1a8);
          TestFailure::~TestFailure(&local_1a8);
          SimpleString::~SimpleString(&local_1b8);
          return;
        }
        if (0x1e < local_c8) {
          SimpleString::SimpleString
                    (&local_140,
                     "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"
                    );
          TestFailure::TestFailure(&local_130,(UtestShell *)pTVar4,&local_140);
          (*pTVar3->_vptr_TestResult[0xd])(pTVar3,&local_130);
          TestFailure::~TestFailure(&local_130);
          SimpleString::~SimpleString(&local_140);
          return;
        }
        local_c8 = local_c8 + 1;
      }
      else {
        SetTestFailureByStatusCode((UtestShell *)plugin_local,_cpid,local_30);
        if ((local_30 & 0xff) == 0x7f) {
          kill(local_2c,0x12);
        }
      }
      bVar1 = true;
      if ((local_2c != -1) && (bVar1 = false, (local_30 & 0x7f) != 0)) {
        bVar1 = (char)(((byte)local_30 & 0x7f) + 1) >> 1 < '\x01';
      }
    } while (bVar1);
  }
  return;
}

Assistant:

static void GccPlatformSpecificRunTestInASeperateProcess(UtestShell* shell, TestPlugin* plugin, TestResult* result)
{
    const pid_t syscallError = -1;
    pid_t cpid;
    pid_t w;
    int status = 0;

    cpid = PlatformSpecificFork();

    if (cpid == syscallError) {
        result->addFailure(TestFailure(shell, "Call to fork() failed"));
        return;
    }

    if (cpid == 0) {            /* Code executed by child */
        const size_t initialFailureCount = result->getFailureCount(); // LCOV_EXCL_LINE
        shell->runOneTestInCurrentProcess(plugin, *result);        // LCOV_EXCL_LINE
        _exit(initialFailureCount < result->getFailureCount());    // LCOV_EXCL_LINE
    } else {                    /* Code executed by parent */
        size_t amountOfRetries = 0;
        do {
            w = PlatformSpecificWaitPid(cpid, &status, WUNTRACED);
            if (w == syscallError) {
                // OS X debugger causes EINTR
                if (EINTR == errno) {
                  if (amountOfRetries > 30) {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"));
                    return;
                  }
                  amountOfRetries++;
                }
                else {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed"));
                    return;
                }
            } else {
                SetTestFailureByStatusCode(shell, result, status);
                if (WIFSTOPPED(status)) kill(w, SIGCONT);
            }
        } while ((w == syscallError) || (!WIFEXITED(status) && !WIFSIGNALED(status)));
    }
}